

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LocalStructuralDominance.cpp
# Opt level: O2

void __thiscall
wasm::LocalStructuralDominance::LocalStructuralDominance
          (LocalStructuralDominance *this,Function *func,Module *wasm,Mode mode)

{
  _Rb_tree_header *p_Var1;
  pointer pTVar2;
  ulong uVar3;
  ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> PVar4;
  ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> PVar5;
  ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> PVar6;
  Function *this_00;
  bool bVar7;
  Type *pTVar8;
  size_t sVar9;
  size_t sVar10;
  TaskFunc_conflict p_Var11;
  uint uVar12;
  pointer pTVar13;
  ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> PVar14;
  reference rVar15;
  Scanner local_188;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *local_68;
  Function *local_60;
  Mode local_54;
  Type local_50;
  Type var;
  Iterator __begin2;
  
  p_Var1 = &(this->nonDominatingIndices)._M_t._M_impl.super__Rb_tree_header;
  (this->nonDominatingIndices)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->nonDominatingIndices)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->nonDominatingIndices)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->nonDominatingIndices)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->nonDominatingIndices)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  if (((wasm->features).features & 0x100) != 0) {
    pTVar2 = (func->vars).super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
             super__Vector_impl_data._M_finish;
    bVar7 = false;
    pTVar13 = (func->vars).super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
              super__Vector_impl_data._M_start;
    local_68 = &this->nonDominatingIndices;
    local_60 = func;
    local_54 = mode;
    for (; pTVar13 != pTVar2; pTVar13 = pTVar13 + 1) {
      local_50.id = pTVar13->id;
      var.id = (uintptr_t)&local_50;
      __begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
           (Type *)0x0;
      PVar14 = (ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>)
               wasm::Type::end((Type *)var.id);
      for (; PVar4.index = (size_t)__begin2.
                                   super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>
                                   .parent, PVar4.parent = (Type *)var.id, PVar14 != PVar4;
          __begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
               (Type *)((long)&(__begin2.
                                super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                               parent)->id + 1)) {
        pTVar8 = wasm::Type::Iterator::operator*((Iterator *)&var);
        if (6 < pTVar8->id && (pTVar8->id & 1) == 0) {
          bVar7 = true;
          break;
        }
      }
    }
    if (bVar7) {
      if (local_54 == NonNullableOnly) {
        pTVar2 = (local_60->vars).super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        bVar7 = false;
        for (pTVar13 = (local_60->vars).super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
                       _M_impl.super__Vector_impl_data._M_start; pTVar13 != pTVar2;
            pTVar13 = pTVar13 + 1) {
          local_50.id = pTVar13->id;
          var.id = (uintptr_t)&local_50;
          __begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
               (Type *)0x0;
          PVar14 = (ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>)
                   wasm::Type::end((Type *)var.id);
          for (; PVar5.index = (size_t)__begin2.
                                       super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>
                                       .parent, PVar5.parent = (Type *)var.id, PVar14 != PVar5;
              __begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
                   (Type *)((long)&(__begin2.
                                    super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>
                                   .parent)->id + 1)) {
            pTVar8 = wasm::Type::Iterator::operator*((Iterator *)&var);
            if (6 < pTVar8->id && (pTVar8->id & 3) == 0) {
              bVar7 = true;
              break;
            }
          }
        }
        if (!bVar7) {
          return;
        }
      }
      this_00 = local_60;
      local_188.super_PostWalker<Scanner,_wasm::Visitor<Scanner,_void>_>.
      super_Walker<Scanner,_wasm::Visitor<Scanner,_void>_>.replacep = (Expression **)0x0;
      local_188.super_PostWalker<Scanner,_wasm::Visitor<Scanner,_void>_>.
      super_Walker<Scanner,_wasm::Visitor<Scanner,_void>_>.stack.usedFixed = 0;
      local_188.super_PostWalker<Scanner,_wasm::Visitor<Scanner,_void>_>.
      super_Walker<Scanner,_wasm::Visitor<Scanner,_void>_>.stack.flexible.
      super__Vector_base<wasm::Walker<Scanner,_wasm::Visitor<Scanner,_void>_>::Task,_std::allocator<wasm::Walker<Scanner,_wasm::Visitor<Scanner,_void>_>::Task>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_188.super_PostWalker<Scanner,_wasm::Visitor<Scanner,_void>_>.
      super_Walker<Scanner,_wasm::Visitor<Scanner,_void>_>.stack.flexible.
      super__Vector_base<wasm::Walker<Scanner,_wasm::Visitor<Scanner,_void>_>::Task,_std::allocator<wasm::Walker<Scanner,_wasm::Visitor<Scanner,_void>_>::Task>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_188.super_PostWalker<Scanner,_wasm::Visitor<Scanner,_void>_>.
      super_Walker<Scanner,_wasm::Visitor<Scanner,_void>_>.stack.flexible.
      super__Vector_base<wasm::Walker<Scanner,_wasm::Visitor<Scanner,_void>_>::Task,_std::allocator<wasm::Walker<Scanner,_wasm::Visitor<Scanner,_void>_>::Task>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_188.super_PostWalker<Scanner,_wasm::Visitor<Scanner,_void>_>.
      super_Walker<Scanner,_wasm::Visitor<Scanner,_void>_>.currFunction = (Function *)0x0;
      local_188.super_PostWalker<Scanner,_wasm::Visitor<Scanner,_void>_>.
      super_Walker<Scanner,_wasm::Visitor<Scanner,_void>_>.currModule = (Module *)0x0;
      local_188.nonDominatingIndices = local_68;
      local_188.localsSet.super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      local_188.localsSet.super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset = 0;
      local_188.localsSet.super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      local_188.localsSet.super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
      local_188.localsSet.super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
      local_188.cleanupStack.
      super__Vector_base<wasm::SmallVector<unsigned_int,_5UL>,_std::allocator<wasm::SmallVector<unsigned_int,_5UL>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_188.cleanupStack.
      super__Vector_base<wasm::SmallVector<unsigned_int,_5UL>,_std::allocator<wasm::SmallVector<unsigned_int,_5UL>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_188.cleanupStack.
      super__Vector_base<wasm::SmallVector<unsigned_int,_5UL>,_std::allocator<wasm::SmallVector<unsigned_int,_5UL>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      sVar9 = Function::getNumLocals(local_60);
      uVar12 = 0;
      std::vector<bool,_std::allocator<bool>_>::resize(&local_188.localsSet,sVar9,false);
      while( true ) {
        sVar9 = Function::getNumParams(this_00);
        if (sVar9 <= uVar12) break;
        rVar15 = std::vector<bool,_std::allocator<bool>_>::operator[]
                           (&local_188.localsSet,(ulong)uVar12);
        *rVar15._M_p = *rVar15._M_p | rVar15._M_mask;
        uVar12 = uVar12 + 1;
      }
      sVar9 = Function::getNumParams(this_00);
      while( true ) {
        sVar10 = Function::getNumLocals(this_00);
        if (sVar10 <= (sVar9 & 0xffffffff)) break;
        local_50 = Function::getLocalType(this_00,(Index)sVar9);
        var.id = (uintptr_t)&local_50;
        __begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
             (Type *)0x0;
        PVar14 = (ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>)
                 wasm::Type::end((Type *)var.id);
        for (; PVar6.index = (size_t)__begin2.
                                     super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>
                                     .parent, PVar6.parent = (Type *)var.id, PVar14 != PVar6;
            __begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
                 (Type *)((long)&(__begin2.
                                  super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>
                                 .parent)->id + 1)) {
          pTVar8 = wasm::Type::Iterator::operator*((Iterator *)&var);
          uVar3 = pTVar8->id;
          if (((uVar3 & 1) == 0 && 6 < uVar3) && ((local_54 == All || ((uVar3 & 2) == 0))))
          goto LAB_00904f11;
        }
        rVar15 = std::vector<bool,_std::allocator<bool>_>::operator[]
                           (&local_188.localsSet,sVar9 & 0xffffffff);
        *rVar15._M_p = *rVar15._M_p | rVar15._M_mask;
LAB_00904f11:
        sVar9 = (size_t)((Index)sVar9 + 1);
      }
      if (((long)local_188.super_PostWalker<Scanner,_wasm::Visitor<Scanner,_void>_>.
                 super_Walker<Scanner,_wasm::Visitor<Scanner,_void>_>.stack.flexible.
                 super__Vector_base<wasm::Walker<Scanner,_wasm::Visitor<Scanner,_void>_>::Task,_std::allocator<wasm::Walker<Scanner,_wasm::Visitor<Scanner,_void>_>::Task>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)local_188.super_PostWalker<Scanner,_wasm::Visitor<Scanner,_void>_>.
                 super_Walker<Scanner,_wasm::Visitor<Scanner,_void>_>.stack.flexible.
                 super__Vector_base<wasm::Walker<Scanner,_wasm::Visitor<Scanner,_void>_>::Task,_std::allocator<wasm::Walker<Scanner,_wasm::Visitor<Scanner,_void>_>::Task>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 4) +
          local_188.super_PostWalker<Scanner,_wasm::Visitor<Scanner,_void>_>.
          super_Walker<Scanner,_wasm::Visitor<Scanner,_void>_>.stack.usedFixed != 0) {
        __assert_fail("stack.size() == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-traversal.h"
                      ,0x12d,
                      "void wasm::Walker<Scanner, wasm::Visitor<Scanner>>::walk(Expression *&) [SubType = Scanner, VisitorType = wasm::Visitor<Scanner>]"
                     );
      }
      Walker<Scanner,_wasm::Visitor<Scanner,_void>_>::pushTask
                ((Walker<Scanner,_wasm::Visitor<Scanner,_void>_> *)&local_188,
                 LocalStructuralDominance(wasm::Function*,wasm::Module&,wasm::
                 LocalStructuralDominance::Mode)::Scanner::scan(Scanner*,wasm::Expression___,
                 &this_00->body);
      while (((long)local_188.super_PostWalker<Scanner,_wasm::Visitor<Scanner,_void>_>.
                    super_Walker<Scanner,_wasm::Visitor<Scanner,_void>_>.stack.flexible.
                    super__Vector_base<wasm::Walker<Scanner,_wasm::Visitor<Scanner,_void>_>::Task,_std::allocator<wasm::Walker<Scanner,_wasm::Visitor<Scanner,_void>_>::Task>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_188.super_PostWalker<Scanner,_wasm::Visitor<Scanner,_void>_>.
                    super_Walker<Scanner,_wasm::Visitor<Scanner,_void>_>.stack.flexible.
                    super__Vector_base<wasm::Walker<Scanner,_wasm::Visitor<Scanner,_void>_>::Task,_std::allocator<wasm::Walker<Scanner,_wasm::Visitor<Scanner,_void>_>::Task>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 4) +
             local_188.super_PostWalker<Scanner,_wasm::Visitor<Scanner,_void>_>.
             super_Walker<Scanner,_wasm::Visitor<Scanner,_void>_>.stack.usedFixed != 0) {
        if (local_188.super_PostWalker<Scanner,_wasm::Visitor<Scanner,_void>_>.
            super_Walker<Scanner,_wasm::Visitor<Scanner,_void>_>.stack.flexible.
            super__Vector_base<wasm::Walker<Scanner,_wasm::Visitor<Scanner,_void>_>::Task,_std::allocator<wasm::Walker<Scanner,_wasm::Visitor<Scanner,_void>_>::Task>_>
            ._M_impl.super__Vector_impl_data._M_start ==
            local_188.super_PostWalker<Scanner,_wasm::Visitor<Scanner,_void>_>.
            super_Walker<Scanner,_wasm::Visitor<Scanner,_void>_>.stack.flexible.
            super__Vector_base<wasm::Walker<Scanner,_wasm::Visitor<Scanner,_void>_>::Task,_std::allocator<wasm::Walker<Scanner,_wasm::Visitor<Scanner,_void>_>::Task>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          if (local_188.super_PostWalker<Scanner,_wasm::Visitor<Scanner,_void>_>.
              super_Walker<Scanner,_wasm::Visitor<Scanner,_void>_>.stack.usedFixed == 0) {
            __assert_fail("usedFixed > 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/support/small_vector.h"
                          ,0x7e,
                          "T &wasm::SmallVector<wasm::Walker<Scanner, wasm::Visitor<Scanner>>::Task, 10>::back() [T = wasm::Walker<Scanner, wasm::Visitor<Scanner>>::Task, N = 10]"
                         );
          }
          p_Var11 = local_188.super_PostWalker<Scanner,_wasm::Visitor<Scanner,_void>_>.
                    super_Walker<Scanner,_wasm::Visitor<Scanner,_void>_>.stack.fixed._M_elems
                    [local_188.super_PostWalker<Scanner,_wasm::Visitor<Scanner,_void>_>.
                     super_Walker<Scanner,_wasm::Visitor<Scanner,_void>_>.stack.usedFixed - 1].func;
          local_188.super_PostWalker<Scanner,_wasm::Visitor<Scanner,_void>_>.
          super_Walker<Scanner,_wasm::Visitor<Scanner,_void>_>.replacep =
               local_188.super_PostWalker<Scanner,_wasm::Visitor<Scanner,_void>_>.
               super_Walker<Scanner,_wasm::Visitor<Scanner,_void>_>.stack.fixed._M_elems
               [local_188.super_PostWalker<Scanner,_wasm::Visitor<Scanner,_void>_>.
                super_Walker<Scanner,_wasm::Visitor<Scanner,_void>_>.stack.usedFixed - 1].currp;
          local_188.super_PostWalker<Scanner,_wasm::Visitor<Scanner,_void>_>.
          super_Walker<Scanner,_wasm::Visitor<Scanner,_void>_>.stack.usedFixed =
               local_188.super_PostWalker<Scanner,_wasm::Visitor<Scanner,_void>_>.
               super_Walker<Scanner,_wasm::Visitor<Scanner,_void>_>.stack.usedFixed - 1;
        }
        else {
          p_Var11 = (TaskFunc_conflict)
                    local_188.super_PostWalker<Scanner,_wasm::Visitor<Scanner,_void>_>.
                    super_Walker<Scanner,_wasm::Visitor<Scanner,_void>_>.stack.flexible.
                    super__Vector_base<wasm::Walker<Scanner,_wasm::Visitor<Scanner,_void>_>::Task,_std::allocator<wasm::Walker<Scanner,_wasm::Visitor<Scanner,_void>_>::Task>_>
                    ._M_impl.super__Vector_impl_data._M_finish[-1].func;
          local_188.super_PostWalker<Scanner,_wasm::Visitor<Scanner,_void>_>.
          super_Walker<Scanner,_wasm::Visitor<Scanner,_void>_>.replacep =
               local_188.super_PostWalker<Scanner,_wasm::Visitor<Scanner,_void>_>.
               super_Walker<Scanner,_wasm::Visitor<Scanner,_void>_>.stack.flexible.
               super__Vector_base<wasm::Walker<Scanner,_wasm::Visitor<Scanner,_void>_>::Task,_std::allocator<wasm::Walker<Scanner,_wasm::Visitor<Scanner,_void>_>::Task>_>
               ._M_impl.super__Vector_impl_data._M_finish[-1].currp;
          local_188.super_PostWalker<Scanner,_wasm::Visitor<Scanner,_void>_>.
          super_Walker<Scanner,_wasm::Visitor<Scanner,_void>_>.stack.flexible.
          super__Vector_base<wasm::Walker<Scanner,_wasm::Visitor<Scanner,_void>_>::Task,_std::allocator<wasm::Walker<Scanner,_wasm::Visitor<Scanner,_void>_>::Task>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               local_188.super_PostWalker<Scanner,_wasm::Visitor<Scanner,_void>_>.
               super_Walker<Scanner,_wasm::Visitor<Scanner,_void>_>.stack.flexible.
               super__Vector_base<wasm::Walker<Scanner,_wasm::Visitor<Scanner,_void>_>::Task,_std::allocator<wasm::Walker<Scanner,_wasm::Visitor<Scanner,_void>_>::Task>_>
               ._M_impl.super__Vector_impl_data._M_finish + -1;
        }
        if (*local_188.super_PostWalker<Scanner,_wasm::Visitor<Scanner,_void>_>.
             super_Walker<Scanner,_wasm::Visitor<Scanner,_void>_>.replacep == (Expression *)0x0) {
          __assert_fail("*task.currp",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-traversal.h"
                        ,0x132,
                        "void wasm::Walker<Scanner, wasm::Visitor<Scanner>>::walk(Expression *&) [SubType = Scanner, VisitorType = wasm::Visitor<Scanner>]"
                       );
        }
        (*p_Var11)(&local_188,
                   local_188.super_PostWalker<Scanner,_wasm::Visitor<Scanner,_void>_>.
                   super_Walker<Scanner,_wasm::Visitor<Scanner,_void>_>.replacep);
      }
      std::
      vector<wasm::SmallVector<unsigned_int,_5UL>,_std::allocator<wasm::SmallVector<unsigned_int,_5UL>_>_>
      ::~vector(&local_188.cleanupStack);
      std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
                (&local_188.localsSet.super__Bvector_base<std::allocator<bool>_>);
      Walker<Scanner,_wasm::Visitor<Scanner,_void>_>::~Walker
                ((Walker<Scanner,_wasm::Visitor<Scanner,_void>_> *)&local_188);
    }
  }
  return;
}

Assistant:

LocalStructuralDominance::LocalStructuralDominance(Function* func,
                                                   Module& wasm,
                                                   Mode mode) {
  if (!wasm.features.hasReferenceTypes()) {
    // No references, so nothing to look at.
    return;
  }

  bool hasRefVar = false;
  for (auto var : func->vars) {
    for (auto type : var) {
      if (type.isRef()) {
        hasRefVar = true;
        break;
      }
    }
  }
  if (!hasRefVar) {
    return;
  }

  if (mode == NonNullableOnly) {
    bool hasNonNullableVar = false;
    for (auto var : func->vars) {
      for (auto type : var) {
        // Check if we have any non-nullable vars (or tuple vars with
        // non-nullable elements) at all.
        if (type.isNonNullable()) {
          hasNonNullableVar = true;
          break;
        }
      }
    }
    if (!hasNonNullableVar) {
      return;
    }
  }

  struct Scanner : public PostWalker<Scanner> {
    std::set<Index>& nonDominatingIndices;

    // The locals that have been set, and so at the current time, they
    // structurally dominate.
    std::vector<bool> localsSet;

    Scanner(Function* func, Mode mode, std::set<Index>& nonDominatingIndices)
      : nonDominatingIndices(nonDominatingIndices) {
      localsSet.resize(func->getNumLocals());

      // Parameters always dominate.
      for (Index i = 0; i < func->getNumParams(); i++) {
        localsSet[i] = true;
      }

      for (Index i = func->getNumParams(); i < func->getNumLocals(); i++) {
        auto localType = func->getLocalType(i);
        bool interesting = false;
        for (auto type : localType) {
          if (type.isRef() && (mode == All || type.isNonNullable())) {
            interesting = true;
            break;
          }
        }
        // Mark locals we don't need to care about as "set". We never do any
        // work for such a local.
        if (!interesting) {
          localsSet[i] = true;
        }
      }

      // Note that we do not need to start a scope for the function body.
      // Logically there is a scope there, but there is no code after it, so
      // there is nothing to clean up when that scope exits, so we may as well
      // not even create a scope. Just start walking the body now.
      walk(func->body);
    }

    using Locals = SmallVector<Index, 5>;

    // When we exit a control flow scope, we must undo the locals that it set.
    std::vector<Locals> cleanupStack;

    static void doBeginScope(Scanner* self, Expression** currp) {
      self->cleanupStack.emplace_back();
    }

    static void doEndScope(Scanner* self, Expression** currp) {
      for (auto index : self->cleanupStack.back()) {
        assert(self->localsSet[index]);
        self->localsSet[index] = false;
      }
      self->cleanupStack.pop_back();
    }

    static void doLocalSet(Scanner* self, Expression** currp) {
      auto index = (*currp)->cast<LocalSet>()->index;
      if (!self->localsSet[index]) {
        // This local is now set until the end of this scope.
        self->localsSet[index] = true;
        // If we are not in the topmost scope, note this for later cleanup.
        if (!self->cleanupStack.empty()) {
          self->cleanupStack.back().push_back(index);
        }
      }
    }

    static void scan(Scanner* self, Expression** currp) {
      // Use a loop to avoid recursing on the last child - we can just go
      // straight into a loop iteration for it.
      while (1) {
        Expression* curr = *currp;

        switch (curr->_id) {
          case Expression::Id::InvalidId:
            WASM_UNREACHABLE("bad id");

          // local.get can just be visited immediately, as it has no children.
          case Expression::Id::LocalGetId: {
            auto index = curr->cast<LocalGet>()->index;
            if (!self->localsSet[index]) {
              self->nonDominatingIndices.insert(index);
            }
            return;
          }
          case Expression::Id::LocalSetId: {
            auto* set = curr->cast<LocalSet>();
            if (!self->localsSet[set->index]) {
              self->pushTask(doLocalSet, currp);
            }
            // Immediately continue in the loop.
            currp = &set->value;
            continue;
          }

          // Control flow structures.
          case Expression::Id::BlockId: {
            auto* block = curr->cast<Block>();
            // Blocks with no name are never emitted in the binary format, so do
            // not create a scope for them.
            if (block->name.is()) {
              self->pushTask(Scanner::doEndScope, currp);
            }
            auto& list = block->list;
            for (int i = int(list.size()) - 1; i >= 0; i--) {
              self->pushTask(Scanner::scan, &list[i]);
            }
            if (block->name.is()) {
              // Just call the task immediately.
              doBeginScope(self, currp);
            }
            return;
          }
          case Expression::Id::IfId: {
            if (curr->cast<If>()->ifFalse) {
              self->pushTask(Scanner::doEndScope, currp);
              self->maybePushTask(Scanner::scan, &curr->cast<If>()->ifFalse);
              self->pushTask(Scanner::doBeginScope, currp);
            }
            self->pushTask(Scanner::doEndScope, currp);
            self->pushTask(Scanner::scan, &curr->cast<If>()->ifTrue);
            self->pushTask(Scanner::doBeginScope, currp);
            // Immediately continue in the loop.
            currp = &curr->cast<If>()->condition;
            continue;
          }
          case Expression::Id::LoopId: {
            self->pushTask(Scanner::doEndScope, currp);
            // Just call the task immediately.
            doBeginScope(self, currp);
            // Immediately continue in the loop.
            currp = &curr->cast<Loop>()->body;
            continue;
          }
          case Expression::Id::TryId: {
            auto& list = curr->cast<Try>()->catchBodies;
            for (int i = int(list.size()) - 1; i >= 0; i--) {
              self->pushTask(Scanner::doEndScope, currp);
              self->pushTask(Scanner::scan, &list[i]);
              self->pushTask(Scanner::doBeginScope, currp);
            }
            self->pushTask(Scanner::doEndScope, currp);
            // Just call the task immediately.
            doBeginScope(self, currp);
            // Immediately continue in the loop.
            currp = &curr->cast<Try>()->body;
            continue;
          }
          case Expression::Id::TryTableId: {
            self->pushTask(Scanner::doEndScope, currp);
            // Just call the task immediately.
            doBeginScope(self, currp);
            // Immediately continue in the try_table.
            currp = &curr->cast<TryTable>()->body;
            continue;
          }

          default: {
            // Control flow structures have been handled. This is an expression,
            // which we scan normally.
            assert(!Properties::isControlFlowStructure(curr));
            PostWalker<Scanner>::scan(self, currp);
            return;
          }
        }
      }
    }

    // Only local.set needs to be visited.
    void pushTask(TaskFunc func, Expression** currp) {
      // Visits to anything but a set can be ignored, so only very specific
      // tasks need to actually be pushed here. In particular, we don't want to
      // push tasks to call doVisit* when those callbacks do nothing.
      if (func == scan || func == doLocalSet || func == doBeginScope ||
          func == doEndScope) {
        PostWalker<Scanner>::pushTask(func, currp);
      }
    }
    void maybePushTask(TaskFunc func, Expression** currp) {
      if (*currp) {
        pushTask(func, currp);
      }
    }
  };

  Scanner(func, mode, nonDominatingIndices);
}